

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

size_t mpack_expect_enum_optional(mpack_reader_t *reader,char **strings,size_t count)

{
  char *__s;
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  size_t in_RAX;
  char *__s1;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  ulong count_00;
  mpack_tag_t mVar7;
  size_t local_38;
  
  sVar5 = count;
  if (reader->error == mpack_ok) {
    mVar7 = mpack_peek_tag(reader);
    if (mVar7.type == mpack_type_str) {
      uVar2 = mpack_expect_str(reader);
      count_00 = (ulong)uVar2;
      __s1 = mpack_read_bytes_inplace_notrack(reader,count_00);
      if (reader->error == mpack_ok) {
        sVar6 = 0;
        local_38 = in_RAX;
        do {
          __s = strings[sVar6];
          sVar4 = strlen(__s);
          if ((sVar4 == count_00) && (iVar3 = bcmp(__s1,__s,count_00), iVar3 == 0)) {
            bVar1 = false;
            local_38 = sVar6;
          }
          else {
            bVar1 = true;
          }
          sVar5 = local_38;
        } while ((bVar1) && (sVar6 = sVar6 + 1, sVar5 = count, count != sVar6));
      }
    }
    else {
      mpack_discard(reader);
    }
  }
  return sVar5;
}

Assistant:

size_t mpack_expect_enum_optional(mpack_reader_t* reader, const char* strings[], size_t count) {
    if (mpack_reader_error(reader) != mpack_ok)
        return count;

    mpack_assert(count != 0, "count cannot be zero; no strings are valid!");
    mpack_assert(strings != NULL, "strings cannot be NULL");

    // the key is only recognized if it is a string
    if (mpack_peek_tag(reader).type != mpack_type_str) {
        mpack_discard(reader);
        return count;
    }

    // read the string in-place
    size_t keylen = mpack_expect_str(reader);
    const char* key = mpack_read_bytes_inplace(reader, keylen);
    mpack_done_str(reader);
    if (mpack_reader_error(reader) != mpack_ok)
        return count;

    // find what key it matches
    for (size_t i = 0; i < count; ++i) {
        const char* other = strings[i];
        size_t otherlen = mpack_strlen(other);
        if (keylen == otherlen && mpack_memcmp(key, other, keylen) == 0)
            return i;
    }

    // no matches
    return count;
}